

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O0

void __thiscall absl::strings_internal::BigUnsigned<4>::ShiftLeft(BigUnsigned<4> *this,int count)

{
  int iVar1;
  int __n;
  int *piVar2;
  byte bVar3;
  int iVar4;
  int in_ESI;
  BigUnsigned<4> *in_RDI;
  int i;
  int word_shift;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int local_18;
  
  if (0 < in_ESI) {
    iVar1 = in_ESI / 0x20;
    if (iVar1 < 4) {
      __n = in_RDI->size_ + iVar1;
      local_18 = 4;
      piVar2 = std::min<int>((int *)&stack0xffffffffffffffec,&local_18);
      in_RDI->size_ = *piVar2;
      iVar4 = in_ESI % 0x20;
      if (iVar4 == 0) {
        std::copy_backward<unsigned_int*,unsigned_int*>
                  ((uint *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   (uint *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                   (uint *)in_RDI);
      }
      else {
        in_stack_ffffffffffffffe0 = 3;
        piVar2 = std::min<int>(&in_RDI->size_,(int *)&stack0xffffffffffffffe0);
        for (in_stack_ffffffffffffffe4 = *piVar2; bVar3 = (byte)iVar4,
            iVar1 < in_stack_ffffffffffffffe4;
            in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe4 + -1) {
          in_RDI->words_[in_stack_ffffffffffffffe4] =
               in_RDI->words_[in_stack_ffffffffffffffe4 - iVar1] << (bVar3 & 0x1f) |
               in_RDI->words_[(in_stack_ffffffffffffffe4 - iVar1) + -1] >> (0x20 - bVar3 & 0x1f);
        }
        in_RDI->words_[iVar1] = in_RDI->words_[0] << (bVar3 & 0x1f);
        if ((in_RDI->size_ < 4) && (in_RDI->words_[in_RDI->size_] != 0)) {
          in_RDI->size_ = in_RDI->size_ + 1;
        }
      }
      std::fill_n<unsigned_int*,int,unsigned_int>
                ((uint *)CONCAT44(iVar4,iVar1),__n,
                 (uint *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
    else {
      SetToZero(in_RDI);
    }
  }
  return;
}

Assistant:

void ShiftLeft(int count) {
    if (count > 0) {
      const int word_shift = count / 32;
      if (word_shift >= max_words) {
        SetToZero();
        return;
      }
      size_ = (std::min)(size_ + word_shift, max_words);
      count %= 32;
      if (count == 0) {
// https://gcc.gnu.org/bugzilla/show_bug.cgi?id=warray-bounds
// shows a lot of bogus -Warray-bounds warnings under GCC.
// This is not the only one in Abseil.
#if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(14, 0)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Warray-bounds"
#endif
        std::copy_backward(words_, words_ + size_ - word_shift, words_ + size_);
#if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(14, 0)
#pragma GCC diagnostic pop
#endif
      } else {
        for (int i = (std::min)(size_, max_words - 1); i > word_shift; --i) {
          words_[i] = (words_[i - word_shift] << count) |
                      (words_[i - word_shift - 1] >> (32 - count));
        }
        words_[word_shift] = words_[0] << count;
        // Grow size_ if necessary.
        if (size_ < max_words && words_[size_]) {
          ++size_;
        }
      }
      std::fill_n(words_, word_shift, 0u);
    }
  }